

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O2

bool __thiscall gnilk::IPCResultSummary::Unmarshal(IPCResultSummary *this,IPCDecoderBase *decoder)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  (*(decoder->super_IPCReader)._vptr_IPCReader[7])(decoder,&this->testsExecuted);
  (*(decoder->super_IPCReader)._vptr_IPCReader[7])(decoder,&this->testsFailed);
  (*(decoder->super_IPCReader)._vptr_IPCReader[0xe])(decoder,&this->durationSec);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(gnilk::IPCObject_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/IPCMessages.cpp:39:23)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(gnilk::IPCObject_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/IPCMessages.cpp:39:23)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  (*(decoder->super_IPCReader)._vptr_IPCReader[0x10])(decoder);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return true;
}

Assistant:

bool IPCResultSummary::Unmarshal(IPCDecoderBase &decoder) {
    decoder.ReadI32(testsExecuted);
    decoder.ReadI32(testsFailed);
    decoder.ReadDouble(durationSec);
    decoder.ReadArray([this](IPCObject *ptrObject) {
       auto tr = dynamic_cast<IPCTestResults *>(ptrObject);
       testResults.push_back(tr);
    });

    return true;
}